

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_service.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ServiceGenerator::GenerateNotImplementedMethods
          (ServiceGenerator *this,Printer *printer)

{
  long lVar1;
  ServiceDescriptor *pSVar2;
  long lVar3;
  long lVar4;
  Formatter format;
  Formatter local_68;
  
  pSVar2 = this->descriptor_;
  if (0 < *(int *)(pSVar2 + 0x28)) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      lVar1 = *(long *)(pSVar2 + 0x20);
      local_68.printer_ = printer;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree(&local_68.vars_._M_t,&(this->vars_)._M_t);
      anon_unknown_3::InitMethodVariables
                ((MethodDescriptor *)(lVar1 + lVar3),this->options_,&local_68);
      Formatter::operator()<>
                (&local_68,
                 "void $classname$::$name$(::$proto_ns$::RpcController* controller,\n                         const $input_type$*,\n                         $output_type$*,\n                         ::google::protobuf::Closure* done) {\n  controller->SetFailed(\"Method $name$() not implemented.\");\n  done->Run();\n}\n\n"
                );
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_68.vars_._M_t);
      lVar4 = lVar4 + 1;
      pSVar2 = this->descriptor_;
      lVar3 = lVar3 + 0x40;
    } while (lVar4 < *(int *)(pSVar2 + 0x28));
  }
  return;
}

Assistant:

void ServiceGenerator::GenerateNotImplementedMethods(io::Printer* printer) {
  for (int i = 0; i < descriptor_->method_count(); i++) {
    const MethodDescriptor* method = descriptor_->method(i);
    Formatter format(printer, vars_);
    InitMethodVariables(method, options_, &format);
    format(
        "void $classname$::$name$(::$proto_ns$::RpcController* controller,\n"
        "                         const $input_type$*,\n"
        "                         $output_type$*,\n"
        "                         ::google::protobuf::Closure* done) {\n"
        "  controller->SetFailed(\"Method $name$() not implemented.\");\n"
        "  done->Run();\n"
        "}\n"
        "\n");
  }
}